

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

void __thiscall menuwindow::autoscroll(menuwindow *this,int n)

{
  int iVar1;
  int iVar2;
  int scr_h;
  int ww;
  int xx;
  int scr_y;
  int y;
  int x;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  iVar2 = (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget.y_;
  iVar1 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                           super_Fl_Group.super_Fl_Widget.box_);
  iVar2 = n * this->itemheight + iVar1 + iVar2 + 2;
  Fl::get_mouse(&local_24,&local_28);
  Fl::screen_work_area(&local_30,&local_2c,&local_34,&local_38,local_24,local_28);
  if (local_2c < iVar2) {
    iVar2 = (iVar2 + this->itemheight) - (local_2c + local_38);
    if (iVar2 < 0) {
      return;
    }
    iVar2 = -10 - iVar2;
  }
  else {
    iVar2 = (local_2c - iVar2) + 10;
  }
  (*(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)(uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                               super_Fl_Group.super_Fl_Widget.x_,
             (ulong)(uint)(iVar2 + (this->super_Fl_Menu_Window).super_Fl_Single_Window.
                                   super_Fl_Window.super_Fl_Group.super_Fl_Widget.y_),
             (ulong)(uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                          super_Fl_Group.super_Fl_Widget.w_,
             (ulong)(uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                          super_Fl_Group.super_Fl_Widget.h_);
  return;
}

Assistant:

void menuwindow::autoscroll(int n) {
  int scr_y, scr_h;
  int Y = y()+Fl::box_dx(box())+2+n*itemheight;

  int xx, ww;
  Fl::screen_work_area(xx, scr_y, ww, scr_h);
  if (Y <= scr_y) Y = scr_y-Y+10;
  else {
    Y = Y+itemheight-scr_h-scr_y;
    if (Y < 0) return;
    Y = -Y-10;
  }
  Fl_Menu_Window::position(x(), y()+Y);
  // y(y()+Y); // don't wait for response from X
}